

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlParserCtxtPtr htmlNewParserCtxt(void)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  
  ctxt = (xmlParserCtxtPtr)(*xmlMalloc)(0x300);
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    htmlErrMemory((xmlParserCtxtPtr)0x0,"NewParserCtxt: out of memory\n");
    ctxt = (xmlParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt,0,0x300);
    iVar1 = htmlInitParserCtxt(ctxt);
    if (iVar1 < 0) {
      htmlFreeParserCtxt(ctxt);
      ctxt = (xmlParserCtxtPtr)0x0;
    }
  }
  return ctxt;
}

Assistant:

htmlParserCtxtPtr
htmlNewParserCtxt(void)
{
    xmlParserCtxtPtr ctxt;

    ctxt = (xmlParserCtxtPtr) xmlMalloc(sizeof(xmlParserCtxt));
    if (ctxt == NULL) {
        htmlErrMemory(NULL, "NewParserCtxt: out of memory\n");
	return(NULL);
    }
    memset(ctxt, 0, sizeof(xmlParserCtxt));
    if (htmlInitParserCtxt(ctxt) < 0) {
        htmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    return(ctxt);
}